

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O3

Node * __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::FindGreaterOrEqual
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this,char **key,Node **prev)

{
  Node *pNVar1;
  int iVar2;
  Node *pNVar3;
  ulong uVar4;
  
  uVar4 = (ulong)((this->max_height_).super___atomic_base<int>._M_i - 1);
  pNVar1 = this->head_;
  do {
    pNVar3 = pNVar1;
    uVar4 = (ulong)(int)uVar4;
    while ((pNVar1 = pNVar3->next_[uVar4]._M_b._M_p, pNVar1 == (Node *)0x0 ||
           (iVar2 = MemTable::KeyComparator::operator()(&this->compare_,pNVar1->key,*key),
           -1 < iVar2))) {
      if (prev != (Node **)0x0) {
        prev[uVar4] = pNVar3;
      }
      if ((int)uVar4 == 0) {
        return pNVar1;
      }
      uVar4 = uVar4 - 1;
    }
  } while( true );
}

Assistant:

typename SkipList<Key, Comparator>::Node*
SkipList<Key, Comparator>::FindGreaterOrEqual(const Key& key,
                                              Node** prev) const {
  Node* x = head_;
  int level = GetMaxHeight() - 1;
  while (true) {
    Node* next = x->Next(level);
    if (KeyIsAfterNode(key, next)) {
      // Keep searching in this list
      x = next;
    } else {
      if (prev != nullptr) prev[level] = x;
      if (level == 0) {
        return next;
      } else {
        // Switch to next list
        level--;
      }
    }
  }
}